

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_decompress.c
# Opt level: O1

size_t FSE_decompress_wksp_bmi2
                 (void *dst,size_t dstCapacity,void *cSrc,size_t cSrcSize,uint maxLog,
                 void *workSpace,size_t wkspSize,int bmi2)

{
  FSE_DTable *dt;
  undefined1 *puVar1;
  byte bVar2;
  ushort uVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  undefined1 *puVar15;
  undefined1 *puVar16;
  ulong uVar17;
  bool bVar18;
  FSE_DState_t state1;
  uint maxSymbolValue;
  uint tableLog;
  BIT_DStream_t local_a8;
  short *local_78;
  FSE_DState_t local_70;
  FSE_DState_t local_60;
  uint local_50;
  uint local_4c;
  size_t local_48;
  void *local_40;
  long local_38;
  
  local_50 = 0xff;
  if (wkspSize < 0x204) {
    return 0xffffffffffffffff;
  }
  bVar18 = false;
  local_78 = (short *)workSpace;
  local_48 = dstCapacity;
  local_40 = dst;
  sVar8 = FSE_readNCount_bmi2((short *)workSpace,&local_50,&local_4c,cSrc,cSrcSize,0);
  pvVar4 = local_40;
  if (sVar8 < 0xffffffffffffff89) {
    if (maxLog < local_4c) {
      sVar8 = 0xffffffffffffffd4;
      bVar18 = false;
    }
    else {
      cSrc = (void *)((long)cSrc + sVar8);
      cSrcSize = cSrcSize - sVar8;
      bVar18 = true;
    }
  }
  if (!bVar18) {
    return sVar8;
  }
  lVar12 = (long)(1 << ((byte)local_4c & 0x1f));
  if (wkspSize <
      ((1L << ((byte)local_4c & 0x3f)) + (ulong)(local_50 + 1) * 2 + lVar12 * 4 + 0xf &
      0xfffffffffffffffc) + 0x204) {
    return 0xffffffffffffffd4;
  }
  dt = (FSE_DTable *)(local_78 + 0x100);
  sVar8 = FSE_buildDTable_internal
                    (dt,local_78,local_50,local_4c,local_78 + (lVar12 + 1) * 2 + 0x100,
                     (wkspSize - (lVar12 * 4 + 4)) - 0x204);
  if (0xffffffffffffff88 < sVar8) {
    return sVar8;
  }
  local_38 = (long)pvVar4 + local_48;
  puVar1 = (undefined1 *)((long)pvVar4 + (local_48 - 3));
  local_a8.ptr = (char *)cSrc;
  local_a8.start = (char *)cSrc;
  if (local_78[0x101] == 0) {
    if (cSrcSize == 0) {
      local_a8.ptr = (char *)0x0;
      local_a8.start = (char *)0x0;
      local_a8.bitContainer = 0;
      local_a8.bitsConsumed = 0;
      local_a8._12_4_ = 0;
      local_a8.limitPtr = (char *)0x0;
      cSrcSize = 0xffffffffffffffb8;
    }
    else {
      local_a8.limitPtr = (char *)((long)cSrc + 8);
      if (cSrcSize < 8) {
        local_a8.bitContainer = (size_t)(byte)*cSrc;
        switch(cSrcSize) {
        case 7:
          local_a8.bitContainer = (ulong)*(byte *)((long)cSrc + 6) << 0x30 | local_a8.bitContainer;
        case 6:
          local_a8.bitContainer = local_a8.bitContainer + ((ulong)*(byte *)((long)cSrc + 5) << 0x28)
          ;
        case 5:
          local_a8.bitContainer = local_a8.bitContainer + ((ulong)*(byte *)((long)cSrc + 4) << 0x20)
          ;
        case 4:
          local_a8.bitContainer =
               local_a8.bitContainer + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
        case 3:
          local_a8.bitContainer = local_a8.bitContainer + (ulong)*(byte *)((long)cSrc + 2) * 0x10000
          ;
        case 2:
          local_a8.bitContainer = local_a8.bitContainer + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
        default:
          bVar2 = *(byte *)((long)cSrc + (cSrcSize - 1));
          uVar7 = 0x1f;
          if (bVar2 != 0) {
            for (; bVar2 >> uVar7 == 0; uVar7 = uVar7 - 1) {
            }
          }
          local_a8.bitsConsumed = ~uVar7 + 9;
          if (bVar2 == 0) {
            local_a8.bitsConsumed = 0;
          }
          if (bVar2 == 0) {
            cSrcSize = 0xffffffffffffffec;
          }
          else {
            local_a8.bitsConsumed = local_a8.bitsConsumed + (int)cSrcSize * -8 + 0x40;
          }
        }
      }
      else {
        local_a8.ptr = (char *)((long)cSrc + (cSrcSize - 8));
        local_a8.bitContainer = *(size_t *)local_a8.ptr;
        bVar2 = *(byte *)((long)cSrc + (cSrcSize - 1));
        uVar7 = 0x1f;
        if (bVar2 != 0) {
          for (; bVar2 >> uVar7 == 0; uVar7 = uVar7 - 1) {
          }
        }
        local_a8.bitsConsumed = ~uVar7 + 9;
        if (bVar2 == 0) {
          local_a8.bitsConsumed = 0;
        }
        if (bVar2 == 0) {
          cSrcSize = 0xffffffffffffffff;
        }
      }
    }
    if (0xffffffffffffff88 < cSrcSize) {
      return cSrcSize;
    }
    FSE_initDState(&local_60,&local_a8,dt);
    FSE_initDState(&local_70,&local_a8,dt);
    puVar15 = (undefined1 *)((long)pvVar4 + 1);
    do {
      iVar5 = (int)local_a8.start;
      if (local_a8.bitsConsumed < 0x41) {
        if (local_a8.ptr < local_a8.limitPtr) {
          if (local_a8.ptr == local_a8.start) goto LAB_00237e8c;
          bVar18 = local_a8.start <=
                   (ulong *)((long)local_a8.ptr - (ulong)(local_a8.bitsConsumed >> 3));
          uVar7 = (int)local_a8.ptr - iVar5;
          if (bVar18) {
            uVar7 = local_a8.bitsConsumed >> 3;
          }
          local_a8.bitsConsumed = local_a8.bitsConsumed + uVar7 * -8;
        }
        else {
          uVar7 = local_a8.bitsConsumed >> 3;
          local_a8.bitsConsumed = local_a8.bitsConsumed & 7;
          bVar18 = true;
        }
        local_a8.ptr = (char *)((long)local_a8.ptr - (ulong)uVar7);
        local_a8.bitContainer = *(size_t *)local_a8.ptr;
      }
      else {
LAB_00237e8c:
        bVar18 = false;
      }
      puVar16 = puVar15 + -1;
      if ((puVar1 <= puVar16) || (!bVar18)) goto LAB_00237f9b;
      uVar10 = (ulong)*(ushort *)((long)local_60.table + local_60.state * 4);
      bVar2 = *(byte *)((long)local_60.table + local_60.state * 4 + 3);
      iVar5 = local_a8.bitsConsumed + bVar2;
      uVar9 = (uint)(local_a8.bitContainer >> (-(char)iVar5 & 0x3fU)) & BIT_mask[bVar2];
      puVar15[-1] = *(undefined1 *)((long)local_60.table + local_60.state * 4 + 2);
      bVar2 = *(byte *)((long)local_70.table + local_70.state * 4 + 3);
      iVar5 = iVar5 + (uint)bVar2;
      uVar11 = (ulong)*(ushort *)((long)local_70.table + local_70.state * 4);
      uVar13 = (uint)(local_a8.bitContainer >> (-(char)iVar5 & 0x3fU)) & BIT_mask[bVar2];
      *puVar15 = *(undefined1 *)((long)local_70.table + local_70.state * 4 + 2);
      bVar2 = *(byte *)((long)local_60.table + uVar10 * 4 + (ulong)uVar9 * 4 + 3);
      iVar5 = iVar5 + (uint)bVar2;
      uVar7 = BIT_mask[bVar2];
      uVar3 = *(ushort *)((long)local_60.table + uVar10 * 4 + (ulong)uVar9 * 4);
      puVar15[1] = *(undefined1 *)((long)local_60.table + uVar10 * 4 + (ulong)uVar9 * 4 + 2);
      bVar2 = *(byte *)((long)local_70.table + uVar11 * 4 + (ulong)uVar13 * 4 + 3);
      local_a8.bitsConsumed = iVar5 + (uint)bVar2;
      local_60.state =
           (ulong)((uint)(local_a8.bitContainer >> (-(char)iVar5 & 0x3fU)) & uVar7) + (ulong)uVar3;
      local_70.state =
           (ulong)((uint)(local_a8.bitContainer >> (-(char)local_a8.bitsConsumed & 0x3fU)) &
                  BIT_mask[bVar2]) +
           (ulong)*(ushort *)((long)local_70.table + uVar11 * 4 + (ulong)uVar13 * 4);
      puVar15[2] = *(undefined1 *)((long)local_70.table + uVar11 * 4 + (ulong)uVar13 * 4 + 2);
      puVar15 = puVar15 + 4;
    } while( true );
  }
  if (cSrcSize == 0) {
    local_a8.ptr = (char *)0x0;
    local_a8.start = (char *)0x0;
    local_a8.bitContainer = 0;
    local_a8.bitsConsumed = 0;
    local_a8._12_4_ = 0;
    local_a8.limitPtr = (char *)0x0;
    cSrcSize = 0xffffffffffffffb8;
  }
  else {
    local_a8.limitPtr = (char *)((long)cSrc + 8);
    if (cSrcSize < 8) {
      local_a8.bitContainer = (size_t)(byte)*cSrc;
      switch(cSrcSize) {
      case 7:
        local_a8.bitContainer = (ulong)*(byte *)((long)cSrc + 6) << 0x30 | local_a8.bitContainer;
      case 6:
        local_a8.bitContainer = local_a8.bitContainer + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
      case 5:
        local_a8.bitContainer = local_a8.bitContainer + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
      case 4:
        local_a8.bitContainer = local_a8.bitContainer + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000
        ;
      case 3:
        local_a8.bitContainer = local_a8.bitContainer + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
      case 2:
        local_a8.bitContainer = local_a8.bitContainer + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
      default:
        bVar2 = *(byte *)((long)cSrc + (cSrcSize - 1));
        uVar7 = 0x1f;
        if (bVar2 != 0) {
          for (; bVar2 >> uVar7 == 0; uVar7 = uVar7 - 1) {
          }
        }
        local_a8.bitsConsumed = ~uVar7 + 9;
        if (bVar2 == 0) {
          local_a8.bitsConsumed = 0;
        }
        if (bVar2 == 0) {
          cSrcSize = 0xffffffffffffffec;
        }
        else {
          local_a8.bitsConsumed = local_a8.bitsConsumed + (int)cSrcSize * -8 + 0x40;
        }
      }
    }
    else {
      local_a8.ptr = (char *)((long)cSrc + (cSrcSize - 8));
      local_a8.bitContainer = *(size_t *)local_a8.ptr;
      bVar2 = *(byte *)((long)cSrc + (cSrcSize - 1));
      uVar7 = 0x1f;
      if (bVar2 != 0) {
        for (; bVar2 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      local_a8.bitsConsumed = ~uVar7 + 9;
      if (bVar2 == 0) {
        local_a8.bitsConsumed = 0;
      }
      if (bVar2 == 0) {
        cSrcSize = 0xffffffffffffffff;
      }
    }
  }
  if (0xffffffffffffff88 < cSrcSize) {
    return cSrcSize;
  }
  FSE_initDState(&local_60,&local_a8,dt);
  FSE_initDState(&local_70,&local_a8,dt);
  puVar15 = (undefined1 *)((long)pvVar4 + 1);
  do {
    iVar5 = (int)local_a8.start;
    if (local_a8.bitsConsumed < 0x41) {
      if (local_a8.ptr < local_a8.limitPtr) {
        if (local_a8.ptr == local_a8.start) goto LAB_00237bc4;
        bVar18 = local_a8.start <=
                 (ulong *)((long)local_a8.ptr - (ulong)(local_a8.bitsConsumed >> 3));
        uVar7 = (int)local_a8.ptr - iVar5;
        if (bVar18) {
          uVar7 = local_a8.bitsConsumed >> 3;
        }
        local_a8.bitsConsumed = local_a8.bitsConsumed + uVar7 * -8;
      }
      else {
        uVar7 = local_a8.bitsConsumed >> 3;
        local_a8.bitsConsumed = local_a8.bitsConsumed & 7;
        bVar18 = true;
      }
      local_a8.ptr = (char *)((long)local_a8.ptr - (ulong)uVar7);
      local_a8.bitContainer = *(size_t *)local_a8.ptr;
    }
    else {
LAB_00237bc4:
      bVar18 = false;
    }
    puVar16 = puVar15 + -1;
    if ((puVar1 <= puVar16) || (!bVar18)) goto LAB_00237ccb;
    bVar2 = *(byte *)((long)local_60.table + local_60.state * 4 + 3);
    iVar5 = local_a8.bitsConsumed + bVar2;
    uVar14 = (local_a8.bitContainer << ((byte)local_a8.bitsConsumed & 0x3f)) >> (-bVar2 & 0x3f);
    uVar11 = (ulong)*(ushort *)((long)local_60.table + local_60.state * 4);
    puVar15[-1] = *(undefined1 *)((long)local_60.table + local_60.state * 4 + 2);
    bVar2 = *(byte *)((long)local_70.table + local_70.state * 4 + 3);
    iVar6 = iVar5 + (uint)bVar2;
    uVar17 = (local_a8.bitContainer << ((byte)iVar5 & 0x3f)) >> (-bVar2 & 0x3f);
    uVar10 = (ulong)*(ushort *)((long)local_70.table + local_70.state * 4);
    *puVar15 = *(undefined1 *)((long)local_70.table + local_70.state * 4 + 2);
    bVar2 = *(byte *)((long)local_60.table + uVar11 * 4 + uVar14 * 4 + 3);
    iVar5 = iVar6 + (uint)bVar2;
    local_60.state =
         ((local_a8.bitContainer << ((byte)iVar6 & 0x3f)) >> (-bVar2 & 0x3f)) +
         (ulong)*(ushort *)((long)local_60.table + uVar11 * 4 + uVar14 * 4);
    puVar15[1] = *(undefined1 *)((long)local_60.table + uVar11 * 4 + uVar14 * 4 + 2);
    bVar2 = *(byte *)((long)local_70.table + uVar10 * 4 + uVar17 * 4 + 3);
    local_a8.bitsConsumed = iVar5 + (uint)bVar2;
    local_70.state =
         ((local_a8.bitContainer << ((byte)iVar5 & 0x3f)) >> (-bVar2 & 0x3f)) +
         (ulong)*(ushort *)((long)local_70.table + uVar10 * 4 + uVar17 * 4);
    puVar15[2] = *(undefined1 *)((long)local_70.table + uVar10 * 4 + uVar17 * 4 + 2);
    puVar15 = puVar15 + 4;
  } while( true );
LAB_00237f9b:
  while( true ) {
    if ((undefined1 *)(local_38 + -2) < puVar16) {
      return 0xffffffffffffffba;
    }
    lVar12 = local_60.state * 4;
    bVar2 = *(byte *)((long)local_60.table + local_60.state * 4 + 3);
    local_a8.bitsConsumed = local_a8.bitsConsumed + bVar2;
    local_60.state =
         (ulong)((uint)(local_a8.bitContainer >> (-(char)local_a8.bitsConsumed & 0x3fU)) &
                BIT_mask[bVar2]) + (ulong)*(ushort *)((long)local_60.table + local_60.state * 4);
    puVar15[-1] = *(undefined1 *)((long)local_60.table + lVar12 + 2);
    if (0x40 < local_a8.bitsConsumed) break;
    if (local_a8.ptr < local_a8.limitPtr) {
      if (local_a8.ptr != local_a8.start) {
        uVar7 = (int)local_a8.ptr - iVar5;
        if (local_a8.start <= (ulong *)((long)local_a8.ptr - (ulong)(local_a8.bitsConsumed >> 3))) {
          uVar7 = local_a8.bitsConsumed >> 3;
        }
        local_a8.bitsConsumed = local_a8.bitsConsumed + uVar7 * -8;
        goto LAB_00238052;
      }
    }
    else {
      uVar7 = local_a8.bitsConsumed >> 3;
      local_a8.bitsConsumed = local_a8.bitsConsumed & 7;
LAB_00238052:
      local_a8.ptr = (char *)((long)local_a8.ptr - (ulong)uVar7);
      local_a8.bitContainer = *(size_t *)local_a8.ptr;
    }
    if ((undefined1 *)(local_38 + -2) < puVar15) {
      return 0xffffffffffffffba;
    }
    lVar12 = local_70.state * 4;
    bVar2 = *(byte *)((long)local_70.table + local_70.state * 4 + 3);
    local_a8.bitsConsumed = local_a8.bitsConsumed + bVar2;
    local_70.state =
         (ulong)((uint)(local_a8.bitContainer >> (-(char)local_a8.bitsConsumed & 0x3fU)) &
                BIT_mask[bVar2]) + (ulong)*(ushort *)((long)local_70.table + local_70.state * 4);
    *puVar15 = *(undefined1 *)((long)local_70.table + lVar12 + 2);
    if (0x40 < local_a8.bitsConsumed) {
      puVar15[1] = *(undefined1 *)((long)local_60.table + local_60.state * 4 + 2);
      goto LAB_0023820b;
    }
    if (local_a8.ptr < local_a8.limitPtr) {
      if (local_a8.ptr != local_a8.start) {
        uVar7 = (int)local_a8.ptr - iVar5;
        if (local_a8.start <= (ulong *)((long)local_a8.ptr - (ulong)(local_a8.bitsConsumed >> 3))) {
          uVar7 = local_a8.bitsConsumed >> 3;
        }
        local_a8.bitsConsumed = local_a8.bitsConsumed + uVar7 * -8;
        goto LAB_002380cd;
      }
    }
    else {
      uVar7 = local_a8.bitsConsumed >> 3;
      local_a8.bitsConsumed = local_a8.bitsConsumed & 7;
LAB_002380cd:
      local_a8.ptr = (char *)((long)local_a8.ptr - (ulong)uVar7);
      local_a8.bitContainer = *(size_t *)local_a8.ptr;
    }
    puVar16 = puVar15 + 1;
    puVar15 = puVar15 + 2;
  }
  *puVar15 = *(undefined1 *)((long)local_70.table + local_70.state * 4 + 2);
  goto LAB_002381c3;
LAB_00237ccb:
  while( true ) {
    if ((undefined1 *)(local_38 + -2) < puVar16) {
      return 0xffffffffffffffba;
    }
    lVar12 = local_60.state * 4;
    bVar2 = *(byte *)((long)local_60.table + local_60.state * 4 + 3);
    uVar7 = local_a8.bitsConsumed + bVar2;
    local_60.state =
         ((local_a8.bitContainer << ((byte)local_a8.bitsConsumed & 0x3f)) >> (-bVar2 & 0x3f)) +
         (ulong)*(ushort *)((long)local_60.table + local_60.state * 4);
    puVar15[-1] = *(undefined1 *)((long)local_60.table + lVar12 + 2);
    if (0x40 < uVar7) break;
    if (local_a8.ptr < local_a8.limitPtr) {
      if (local_a8.ptr != local_a8.start) {
        uVar9 = (int)local_a8.ptr - iVar5;
        if (local_a8.start <= (ulong *)((long)local_a8.ptr - (ulong)(uVar7 >> 3))) {
          uVar9 = uVar7 >> 3;
        }
        uVar7 = uVar7 + uVar9 * -8;
        goto LAB_00237d79;
      }
    }
    else {
      uVar9 = uVar7 >> 3;
      uVar7 = uVar7 & 7;
LAB_00237d79:
      local_a8.ptr = (char *)((long)local_a8.ptr - (ulong)uVar9);
      local_a8.bitContainer = *(size_t *)local_a8.ptr;
    }
    if ((undefined1 *)(local_38 + -2) < puVar15) {
      return 0xffffffffffffffba;
    }
    lVar12 = local_70.state * 4;
    bVar2 = *(byte *)((long)local_70.table + local_70.state * 4 + 3);
    local_a8.bitsConsumed = uVar7 + bVar2;
    local_70.state =
         ((local_a8.bitContainer << ((byte)uVar7 & 0x3f)) >> (-bVar2 & 0x3f)) +
         (ulong)*(ushort *)((long)local_70.table + local_70.state * 4);
    *puVar15 = *(undefined1 *)((long)local_70.table + lVar12 + 2);
    if (0x40 < local_a8.bitsConsumed) {
      puVar15[1] = *(undefined1 *)((long)local_60.table + local_60.state * 4 + 2);
LAB_0023820b:
      puVar15 = puVar15 + 2;
      goto LAB_0023820f;
    }
    if (local_a8.ptr < local_a8.limitPtr) {
      if (local_a8.ptr != local_a8.start) {
        uVar7 = (int)local_a8.ptr - iVar5;
        if (local_a8.start <= (ulong *)((long)local_a8.ptr - (ulong)(local_a8.bitsConsumed >> 3))) {
          uVar7 = local_a8.bitsConsumed >> 3;
        }
        local_a8.bitsConsumed = local_a8.bitsConsumed + uVar7 * -8;
        goto LAB_00237df6;
      }
    }
    else {
      uVar7 = local_a8.bitsConsumed >> 3;
      local_a8.bitsConsumed = local_a8.bitsConsumed & 7;
LAB_00237df6:
      local_a8.ptr = (char *)((long)local_a8.ptr - (ulong)uVar7);
      local_a8.bitContainer = *(size_t *)local_a8.ptr;
    }
    puVar16 = puVar15 + 1;
    puVar15 = puVar15 + 2;
  }
  *puVar15 = *(undefined1 *)((long)local_70.table + local_70.state * 4 + 2);
LAB_002381c3:
  puVar15 = puVar15 + 1;
LAB_0023820f:
  return (long)puVar15 - (long)local_40;
}

Assistant:

size_t FSE_decompress_wksp_bmi2(void* dst, size_t dstCapacity, const void* cSrc, size_t cSrcSize, unsigned maxLog, void* workSpace, size_t wkspSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        return FSE_decompress_wksp_body_bmi2(dst, dstCapacity, cSrc, cSrcSize, maxLog, workSpace, wkspSize);
    }
#endif
    (void)bmi2;
    return FSE_decompress_wksp_body_default(dst, dstCapacity, cSrc, cSrcSize, maxLog, workSpace, wkspSize);
}